

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O3

bool __thiscall
wallet::LegacyDataSPKM::GetKeyOrigin(LegacyDataSPKM *this,CKeyID *keyID,KeyOriginInfo *info)

{
  const_iterator cVar1;
  _Rb_tree_header *p_Var2;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock34;
  CKeyMetadata meta;
  unique_lock<std::recursive_mutex> local_b8;
  _Base_ptr local_a8;
  int64_t iStack_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  _Base_ptr local_78;
  _Base_ptr p_Stack_70;
  uchar local_68 [8];
  uchar local_60 [4];
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_58;
  bool local_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  CKeyMetadata::CKeyMetadata((CKeyMetadata *)&local_a8);
  local_b8._M_device = &(this->super_FillableSigningProvider).cs_KeyStore.super_recursive_mutex;
  local_b8._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&local_b8);
  cVar1 = std::
          _Rb_tree<CKeyID,_std::pair<const_CKeyID,_wallet::CKeyMetadata>,_std::_Select1st<std::pair<const_CKeyID,_wallet::CKeyMetadata>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_wallet::CKeyMetadata>_>_>
          ::find(&(this->mapKeyMetadata)._M_t,keyID);
  p_Var2 = &(this->mapKeyMetadata)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)cVar1._M_node == p_Var2) {
    std::unique_lock<std::recursive_mutex>::~unique_lock(&local_b8);
  }
  else {
    local_a8 = cVar1._M_node[1]._M_right;
    iStack_a0 = *(int64_t *)(cVar1._M_node + 2);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              (&local_98,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &cVar1._M_node[2]._M_parent);
    local_68._0_4_ = *(undefined4 *)&cVar1._M_node[3]._M_right;
    local_78 = cVar1._M_node[3]._M_parent;
    p_Stack_70 = cVar1._M_node[3]._M_left;
    local_60 = (uchar  [4])cVar1._M_node[4]._M_color;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
              (&local_58,
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&cVar1._M_node[4]._M_parent);
    local_40 = SUB41(cVar1._M_node[5]._M_color,0);
    std::unique_lock<std::recursive_mutex>::~unique_lock(&local_b8);
    if (local_40 == true) {
      *&info->fingerprint = local_60;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=(&info->path,&local_58);
    }
    else {
      *(undefined4 *)info->fingerprint =
           *(undefined4 *)(keyID->super_uint160).super_base_blob<160U>.m_data._M_elems;
    }
  }
  if (local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return (_Rb_tree_header *)cVar1._M_node != p_Var2;
  }
  __stack_chk_fail();
}

Assistant:

bool LegacyDataSPKM::GetKeyOrigin(const CKeyID& keyID, KeyOriginInfo& info) const
{
    CKeyMetadata meta;
    {
        LOCK(cs_KeyStore);
        auto it = mapKeyMetadata.find(keyID);
        if (it == mapKeyMetadata.end()) {
            return false;
        }
        meta = it->second;
    }
    if (meta.has_key_origin) {
        std::copy(meta.key_origin.fingerprint, meta.key_origin.fingerprint + 4, info.fingerprint);
        info.path = meta.key_origin.path;
    } else { // Single pubkeys get the master fingerprint of themselves
        std::copy(keyID.begin(), keyID.begin() + 4, info.fingerprint);
    }
    return true;
}